

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.hpp
# Opt level: O1

int __thiscall TasGrid::CustomTabulated::getNumPoints(CustomTabulated *this,int level)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"number of points","");
  checkLevel(this,level,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (this->num_nodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[level];
}

Assistant:

int getNumPoints(int level) const{ checkLevel(level, "number of points"); return num_nodes[level]; }